

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O3

err_t bignParamsStd(bign_params *params,char *name)

{
  bool_t bVar1;
  int iVar2;
  size_t count;
  err_t eVar3;
  octet *src;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar3 = 0x6d;
  }
  else {
    eVar3 = 0;
    memSet(params,'\0',0x150);
    iVar2 = strCmp(name,"1.2.112.0.2.0.34.101.45.3.1");
    if (iVar2 == 0) {
      params->l = 0x80;
      memCopy(params->p,_curve128v1_p,0x20);
      memCopy(params->a,_curve128v1_a,0x20);
      memCopy(params->seed,"^8\x01",8);
      memCopy(params->b,_curve128v1_b,0x20);
      memCopy(params->q,_curve128v1_q,0x20);
      memCopy(params->yG,_curve128v1_yG,0x20);
    }
    else {
      iVar2 = strCmp(name,"1.2.112.0.2.0.34.101.45.3.2");
      if (iVar2 == 0) {
        params->l = 0xc0;
        memCopy(params->p,_curve192v1_p,0x30);
        memCopy(params->a,_curve192v1_a,0x30);
        memCopy(params->seed,_curve192v1_seed,8);
        memCopy(params->b,_curve192v1_b,0x30);
        memCopy(params->q,_curve192v1_q,0x30);
        src = _curve192v1_yG;
        count = 0x30;
      }
      else {
        iVar2 = strCmp(name,"1.2.112.0.2.0.34.101.45.3.3");
        if (iVar2 != 0) {
          return 0xca;
        }
        params->l = 0x100;
        memCopy(params->p,_curve256v1_p,0x40);
        memCopy(params->a,_curve256v1_a,0x40);
        memCopy(params->seed,_curve256v1_seed,8);
        memCopy(params->b,_curve256v1_b,0x40);
        memCopy(params->q,_curve256v1_q,0x40);
        src = _curve256v1_yG;
        count = 0x40;
      }
      memCopy(params->yG,src,count);
      eVar3 = 0;
    }
  }
  return eVar3;
}

Assistant:

err_t bignParamsStd(bign_params* params, const char* name)
{
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	memSetZero(params, sizeof(bign_params));
	if (strEq(name, _curve128v1_name))
	{
		params->l = 128;
		memCopy(params->p, _curve128v1_p, 32);
		memCopy(params->a, _curve128v1_a, 32);
		memCopy(params->seed, _curve128v1_seed, 8);
		memCopy(params->b, _curve128v1_b, 32);
		memCopy(params->q, _curve128v1_q, 32);
		memCopy(params->yG, _curve128v1_yG, 32);
		return ERR_OK;
	}
	if (strEq(name, _curve192v1_name))
	{
		params->l = 192;
		memCopy(params->p, _curve192v1_p, 48);
		memCopy(params->a, _curve192v1_a, 48);
		memCopy(params->seed, _curve192v1_seed, 8);
		memCopy(params->b, _curve192v1_b, 48);
		memCopy(params->q, _curve192v1_q, 48);
		memCopy(params->yG, _curve192v1_yG, 48);
		return ERR_OK;
	}
	if (strEq(name, _curve256v1_name))
	{
		params->l = 256;
		memCopy(params->p, _curve256v1_p, 64);
		memCopy(params->a, _curve256v1_a, 64);
		memCopy(params->seed, _curve256v1_seed, 8);
		memCopy(params->b, _curve256v1_b, 64);
		memCopy(params->q, _curve256v1_q, 64);
		memCopy(params->yG, _curve256v1_yG, 64);
		return ERR_OK;
	}
	return ERR_FILE_NOT_FOUND;
}